

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_21::RedundantSetElimination::create(RedundantSetElimination *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x350);
  memset(__s,0,0x350);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  __s[0x26] = (_func_int *)0x0;
  __s[0x27] = (_func_int *)0x0;
  __s[0x28] = (_func_int *)0x0;
  __s[0x29] = (_func_int *)0x0;
  __s[0x2a] = (_func_int *)0x0;
  __s[0x2b] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)(__s + 0x30);
  __s[0x33] = (_func_int *)(__s + 0x30);
  memset(__s + 0x34,0,0xb2);
  __s[0x4e] = (_func_int *)(__s + 0x4c);
  __s[0x4f] = (_func_int *)(__s + 0x4c);
  *__s = (_func_int *)&PTR__RedundantSetElimination_01075268;
  *(undefined1 *)(__s + 0x51) = 1;
  __s[0x54] = (_func_int *)(__s + 0x5a);
  __s[0x55] = (_func_int *)0x1;
  __s[0x56] = (_func_int *)0x0;
  __s[0x57] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x58) = 0x3f800000;
  __s[0x59] = (_func_int *)0x0;
  __s[0x5a] = (_func_int *)0x0;
  __s[0x5b] = (_func_int *)(__s + 0x61);
  __s[0x5c] = (_func_int *)0x1;
  __s[0x5d] = (_func_int *)0x0;
  __s[0x5e] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x5f) = 0x3f800000;
  __s[0x60] = (_func_int *)0x0;
  __s[0x61] = (_func_int *)0x0;
  __s[0x62] = (_func_int *)(__s + 0x68);
  __s[99] = (_func_int *)0x1;
  __s[100] = (_func_int *)0x0;
  __s[0x65] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x66) = 0x3f800000;
  __s[0x67] = (_func_int *)0x0;
  __s[0x68] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<RedundantSetElimination>();
  }